

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O1

void __thiscall
ExternalFixupMembersImport_Addend_Test::TestBody(ExternalFixupMembersImport_Addend_Test *this)

{
  internal iVar1;
  database *db;
  ulong uVar2;
  undefined1 auVar3 [8];
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  error_code eVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  mock_mutex mutex;
  external_fixup_collection fixups;
  parser<pstore::exchange::import_ns::callbacks> parser1;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_names;
  undefined1 local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  AssertHelper local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  mutex_type local_1c9;
  error_code local_1c8;
  long local_1b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a8;
  AssertHelper local_1a0;
  not_null<pstore::transaction_base_*> local_198;
  undefined1 local_190 [8];
  bool local_188 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  error_code local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  not_null<external_fixup_collection_*> local_e8;
  transaction<std::unique_lock<mock_mutex>_> local_e0;
  string_mapping local_a8;
  
  db = &(this->super_ExternalFixupMembersImport).db_;
  local_190 = (undefined1  [8])&local_1c9;
  local_188[0] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_190);
  local_188[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_e0,db,(unique_lock<mock_mutex> *)local_190);
  if ((local_188[0] == true) && (local_190 != (undefined1  [8])0x0)) {
    local_188[0] = false;
  }
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_198.ptr_ = &local_e0.super_transaction_base;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_198);
  local_190 = (undefined1  [8])local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"name","");
  eVar5 = pstore::exchange::import_ns::string_mapping::add_string
                    (&local_a8,(not_null<transaction_base_*>)local_198.ptr_,(string *)local_190);
  local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar5._M_cat;
  local_1f0._0_4_ = eVar5._M_value;
  local_1c8._0_8_ = (ulong)(uint)local_1c8._4_4_ << 0x20;
  local_1c8._M_cat = (error_category *)std::_V2::system_category();
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_220,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",(error_code *)local_1f0,&local_1c8);
  if (local_190 != (undefined1  [8])local_180) {
    operator_delete((void *)local_190,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (local_218 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_218->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x24f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1f0,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
    if (local_190 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_190 + 8))();
    }
    if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218);
    }
    goto LAB_0018685a;
  }
  if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_218,local_218);
  }
  local_1c8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_1c8._M_cat = (error_category *)0x0;
  local_1b8 = 0;
  local_220 = (undefined1  [8])&local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"{ \"name\":0, \"type\":17, \"offset\":19 }","");
  local_e8.ptr_ =
       (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
       &local_1c8;
  pstore::gsl::
  not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
  ::ensure_invariant(&local_e8);
  anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
            ((parser<pstore::exchange::import_ns::callbacks> *)local_190,(string *)local_220,db,
             &local_a8,local_e8);
  if (local_220 != (undefined1  [8])&local_210) {
    operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
  }
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,local_138._M_value == 0);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_138._M_value != 0) {
    testing::Message::Message((Message *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_138._M_cat + 0x20))(local_220,local_138._M_cat,local_138._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8._M_head_impl + 0x10),(char *)local_220,(long)local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f0,(internal *)&local_200,(AssertionResult *)"parser1.has_error ()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x256,(char *)local_1f0);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1f0 != (undefined1  [8])&local_1e0) {
      operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
    }
    if (local_220 != (undefined1  [8])&local_210) {
      operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
    }
    if (local_1a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  local_1f0 = (undefined1  [8])((long)local_1c8._M_cat - local_1c8._0_8_ >> 5);
  local_200.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_220,"fixups.size ()","1U",(unsigned_long *)local_1f0,
             (uint *)&local_200);
  iVar1 = local_220[0];
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f0);
    if (local_218 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_218->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,600,pcVar4);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1f0 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_1f0 + 8))();
    }
    if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_188);
    if (local_190 != (undefined1  [8])0x0) {
      operator_delete((void *)local_190,0x68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0018685a;
    uVar2 = local_1b8 - local_1c8._0_8_;
    auVar3 = (undefined1  [8])local_1c8._0_8_;
  }
  else {
    if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218);
    }
    local_1f0 = (undefined1  [8])((ulong)local_1f0 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)local_220,"fixups[0].addend","0",(long *)(local_1c8._0_8_ + 0x18),
               (int *)local_1f0);
    if (local_220[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1f0);
      if (local_218 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_218->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x259,pcVar4);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      if (local_1f0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1f0 + 8))();
      }
    }
    if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_188);
    if (local_190 != (undefined1  [8])0x0) {
      operator_delete((void *)local_190,0x68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_1c8._0_8_,local_1b8 - local_1c8._0_8_);
    }
    if (iVar1 == (internal)0x0) goto LAB_0018685a;
    local_220 = (undefined1  [8])&local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":true }","")
    ;
    anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
              ((parser<pstore::exchange::import_ns::callbacks> *)local_190,(string *)local_220,db,
               &local_a8);
    if (local_220 != (undefined1  [8])&local_210) {
      operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
    }
    local_1f0[0] = local_138._M_value != 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_138._M_value == 0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._0_8_ + 0x10),"Expected the parse to fail",0x1a);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_220,(internal *)local_1f0,(AssertionResult *)"parser2.has_error ()"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x25f,(char *)local_220);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      if (local_220 != (undefined1  [8])&local_210) {
        operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_1c8._0_8_ + 8))();
      }
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
    eVar5 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar5._M_cat;
    local_1f0._0_4_ = eVar5._M_value;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)local_220,"parser2.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",&local_138
               ,(error_code *)local_1f0);
    if (local_220[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1f0);
      if (local_218 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_218->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x261,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if (local_1f0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1f0 + 8))();
      }
    }
    if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_218,local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_188);
    if (local_190 == (undefined1  [8])0x0) goto LAB_0018685a;
    uVar2 = 0x68;
    auVar3 = local_190;
  }
  operator_delete((void *)auVar3,uVar2);
LAB_0018685a:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  local_e0.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&local_e0.super_transaction_base);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Addend) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});
    pstore::exchange::import_ns::string_mapping imported_names;
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The "addend" key is missing altogether. That's okay: the default is 0.
    {
        external_fixup_collection fixups;
        auto const parser1 =
            this->parse (R"({ "name":0, "type":17, "offset":19 })", &db_, imported_names, &fixups);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
        ASSERT_EQ (fixups.size (), 1U);
        EXPECT_EQ (fixups[0].addend, 0);
    }
    // The "addend" key has the wrong type.
    {
        auto const parser2 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":true })",
                                          &db_, imported_names);
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}